

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Statement * callStatement(void)

{
  Expression *pEVar1;
  Statement *in_RDI;
  Token TStack_28;
  
  in_RDI->type = STATEMENT_CALL;
  (in_RDI->field_1).blockStatement.statements = (Statement *)0x0;
  (in_RDI->field_1).blockStatement.numStatements = (head->value).line;
  pEVar1 = call();
  (in_RDI->field_1).ifStatement.condition = pEVar1;
  consume(&TStack_28,TOKEN_NEWLINE,"Expected newline after routine call!");
  return in_RDI;
}

Assistant:

static Statement callStatement(){
    Statement s;
    s.type = STATEMENT_CALL;
    s.callStatement.callee = NULL;
    s.callStatement.line = presentLine();
    s.callStatement.callee = call();
    consume(TOKEN_NEWLINE, "Expected newline after routine call!");
    return s;
}